

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O2

bool __thiscall
ON_Linetype::SetTaper(ON_Linetype *this,double startWidth,ON_2dPoint taperPoint,double endWidth)

{
  ON_LinetypePrivate *pOVar1;
  ON_2dPoint *__s;
  bool bVar2;
  ON_LinetypePrivate *pOVar3;
  ON_2dPoint local_40;
  double local_30;
  ON_2dPoint local_28;
  
  local_40.y = taperPoint.y;
  local_40.x = taperPoint.x;
  bVar2 = false;
  if ((0.0 <= startWidth) && (bVar2 = false, 0.0 <= endWidth)) {
    local_30 = endWidth;
    bVar2 = ON_2dPoint::IsValid(&local_40);
    if (bVar2) {
      bVar2 = false;
      if (((0.0 <= local_40.x) && (local_40.x <= 1.0)) && (0.0 <= local_40.y)) {
        pOVar1 = this->m_private;
        __s = (pOVar1->m_taper_points).m_a;
        pOVar3 = pOVar1;
        if (__s != (ON_2dPoint *)0x0) {
          memset(__s,0,(long)(pOVar1->m_taper_points).m_capacity << 4);
          pOVar3 = this->m_private;
        }
        (pOVar1->m_taper_points).m_count = 0;
        ON_2dPoint::ON_2dPoint(&local_28,0.0,startWidth);
        ON_SimpleArray<ON_2dPoint>::Append(&pOVar3->m_taper_points,&local_28);
        ON_SimpleArray<ON_2dPoint>::Append(&this->m_private->m_taper_points,&local_40);
        pOVar1 = this->m_private;
        ON_2dPoint::ON_2dPoint(&local_28,1.0,local_30);
        ON_SimpleArray<ON_2dPoint>::Append(&pOVar1->m_taper_points,&local_28);
        bVar2 = true;
      }
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool ON_Linetype::SetTaper(double startWidth, ON_2dPoint taperPoint, double endWidth)
{
  if (startWidth < 0 || endWidth < 0)
    return false;

  if (!taperPoint.IsValid())
    return false;
  if (taperPoint.x < 0.0 || taperPoint.x > 1.0)
    return false;
  if (taperPoint.y < 0.0)
    return false;

  m_private->m_taper_points.Empty();
  m_private->m_taper_points.Append(ON_2dPoint(0, startWidth));
  m_private->m_taper_points.Append(taperPoint);
  m_private->m_taper_points.Append(ON_2dPoint(1.0, endWidth));
  return true;
}